

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_change.c
# Opt level: O3

int speed_segment_mix(mixed_segment *segment)

{
  undefined8 *puVar1;
  int error;
  char *__s;
  mixed_buffer *buffer;
  uint32_t size;
  uint32_t out;
  uint32_t in;
  SRC_DATA src_data;
  uint32_t local_70;
  uint32_t local_6c;
  SRC_DATA local_68;
  
  puVar1 = (undefined8 *)segment->data;
  local_68.end_of_input = 0;
  local_68._52_4_ = 0;
  local_68.src_ratio = 0.0;
  local_68.input_frames_used = 0;
  local_68.output_frames_gen = 0;
  local_68.input_frames = 0;
  local_68.output_frames = 0;
  local_68.data_in = (float *)0x0;
  local_68.data_out = (float *)0x0;
  local_6c = 0xffffffff;
  local_70 = 0xffffffff;
  mixed_buffer_request_read(&local_68.data_in,&local_6c,(mixed_buffer *)*puVar1);
  mixed_buffer_request_write(&local_68.data_out,&local_70,(mixed_buffer *)puVar1[1]);
  local_68.src_ratio = 1.0 / (double)puVar1[3];
  local_68.input_frames = (long)local_6c;
  local_68.output_frames = (long)local_70;
  if (local_70 == 0 || local_68.input_frames == 0) {
    buffer = (mixed_buffer *)puVar1[1];
    size = 0;
  }
  else {
    error = src_process((SRC_STATE *)puVar1[2],&local_68);
    if (error != 0) {
      __s = src_strerror(error);
      puts(__s);
      mixed_err(0xf);
      return 0;
    }
    mixed_buffer_finish_read((uint32_t)local_68.input_frames_used,(mixed_buffer *)*puVar1);
    buffer = (mixed_buffer *)puVar1[1];
    size = (uint32_t)local_68.output_frames_gen;
  }
  mixed_buffer_finish_write(size,buffer);
  return 1;
}

Assistant:

int speed_segment_mix(struct mixed_segment *segment){
  struct speed_segment_data *data = (struct speed_segment_data *)segment->data;
  SRC_DATA src_data = {0};
  uint32_t in = UINT32_MAX, out = UINT32_MAX;
  mixed_buffer_request_read((float **)&src_data.data_in, &in, data->in);
  mixed_buffer_request_write(&src_data.data_out, &out, data->out);
  src_data.src_ratio = 1.0 / data->speed;
  src_data.input_frames = in;
  src_data.output_frames = out;
  if(src_data.input_frames && src_data.output_frames){
    int e = src_process(data->resample_state, &src_data);
    if(e){
      printf("%s\n", src_strerror(e));
      mixed_err(MIXED_RESAMPLE_FAILED);
      return 0;
    }
    mixed_buffer_finish_read(src_data.input_frames_used, data->in);
    mixed_buffer_finish_write(src_data.output_frames_gen, data->out);
  }else{
    mixed_buffer_finish_write(0, data->out);
  }
  return 1;
}